

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchChoice.c
# Opt level: O0

Aig_Man_t * Dch_DeriveChoiceAigInt(Aig_Man_t *pAig,int fSkipRedSupps)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pChoices;
  int fSkipRedSupps_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Aig_ManObjNumMax(pAig);
  p = Aig_ManStart(iVar1);
  iVar1 = Aig_ManObjNumMax(pAig);
  ppAVar2 = (Aig_Obj_t **)calloc((long)iVar1,8);
  p->pEquivs = ppAVar2;
  iVar1 = Aig_ManObjNumMax(pAig);
  ppAVar2 = (Aig_Obj_t **)calloc((long)iVar1,8);
  p->pReprs = ppAVar2;
  Aig_ManCleanData(pAig);
  pAVar3 = Aig_ManConst1(p);
  pAVar4 = Aig_ManConst1(pAig);
  (pAVar4->field_5).pData = pAVar3;
  for (local_2c = 0; iVar1 = Vec_PtrSize(pAig->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar5 = Vec_PtrEntry(pAig->vCis,local_2c);
    pAVar3 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
  }
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    __assert_fail("pAig->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/dch/dchChoice.c"
                  ,0x1fd,"Aig_Man_t *Dch_DeriveChoiceAigInt(Aig_Man_t *, int)");
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pAig->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,local_2c);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      Dch_DeriveChoiceAigNode(p,pAig,pAVar3,fSkipRedSupps);
    }
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(pAig->vCos), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_2c);
    pAVar3 = Aig_ObjChild0CopyRepr(p,pAVar3);
    Aig_ObjCreateCo(p,pAVar3);
  }
  iVar1 = Aig_ManRegNum(pAig);
  Aig_ManSetRegNum(p,iVar1);
  return p;
}

Assistant:

Aig_Man_t * Dch_DeriveChoiceAigInt( Aig_Man_t * pAig, int fSkipRedSupps )
{
    Aig_Man_t * pChoices;
    Aig_Obj_t * pObj;
    int i;
    // start recording equivalences
    pChoices = Aig_ManStart( Aig_ManObjNumMax(pAig) );
    pChoices->pEquivs = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    pChoices->pReprs  = ABC_CALLOC( Aig_Obj_t *, Aig_ManObjNumMax(pAig) );
    // map constants and PIs
    Aig_ManCleanData( pAig );
    Aig_ManConst1(pAig)->pData = Aig_ManConst1(pChoices);
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pChoices );
    // construct choices for the internal nodes
    assert( pAig->pReprs != NULL );
    Aig_ManForEachNode( pAig, pObj, i ) 
        Dch_DeriveChoiceAigNode( pChoices, pAig, pObj, fSkipRedSupps );
    Aig_ManForEachCo( pAig, pObj, i )
        Aig_ObjCreateCo( pChoices, Aig_ObjChild0CopyRepr(pChoices, pObj) );
    Aig_ManSetRegNum( pChoices, Aig_ManRegNum(pAig) );
    return pChoices;
}